

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::Subprocess::Subprocess(Subprocess *this,Subprocess *other)

{
  Subprocess *this_00;
  unique_ptr<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  *this_01;
  MovableState *this_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  Subprocess *local_18;
  Subprocess *other_local;
  Subprocess *this_local;
  
  local_18 = other;
  other_local = this;
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_28);
  Args::Args(&this->args,local_28);
  ::std::
  unique_ptr<perfetto::base::Subprocess::MovableState,std::default_delete<perfetto::base::Subprocess::MovableState>>
  ::unique_ptr<std::default_delete<perfetto::base::Subprocess::MovableState>,void>
            ((unique_ptr<perfetto::base::Subprocess::MovableState,std::default_delete<perfetto::base::Subprocess::MovableState>>
              *)&this->s_);
  std::
  unique_ptr<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ::operator=(&this->s_,&local_18->s_);
  Args::operator=(&this->args,&local_18->args);
  this_01 = &local_18->s_;
  this_02 = (MovableState *)operator_new(0x68);
  *(undefined8 *)&(this_02->exit_status_pipe).wr = 0;
  this_02->input_written = 0;
  (this_02->rusage)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::ResourceUsage,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_false>._M_head_impl =
       (ResourceUsage *)0x0;
  this_02->timed_out = false;
  *(undefined3 *)&this_02->field_0x49 = 0;
  (this_02->exit_status_pipe).rd = 0;
  (this_02->output).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_02->output).field_2 + 8) = 0;
  *(undefined8 *)&this_02->output = 0;
  (this_02->output)._M_string_length = 0;
  this_02->pid = 0;
  this_02->status = kNotStarted;
  *(undefined8 *)&this_02->returncode = 0;
  (this_02->stdin_pipe).rd = 0;
  (this_02->stdin_pipe).wr = 0;
  (this_02->stdouterr_pipe).rd = 0;
  (this_02->stdouterr_pipe).wr = 0;
  (this_02->waitpid_thread)._M_id._M_thread = 0;
  MovableState::MovableState(this_02);
  std::
  unique_ptr<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ::reset(this_01,this_02);
  ~Subprocess(local_18);
  this_00 = local_18;
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_38);
  Subprocess(this_00,local_38);
  return;
}

Assistant:

Subprocess::Subprocess(Subprocess&& other) noexcept {
  static_assert(sizeof(Subprocess) ==
                    sizeof(std::tuple<std::unique_ptr<MovableState>, Args>),
                "base::Subprocess' move ctor needs updating");
  s_ = std::move(other.s_);
  args = std::move(other.args);

  // Reset the state of the moved-from object.
  other.s_.reset(new MovableState());
  other.~Subprocess();
  new (&other) Subprocess();
}